

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepGetNumRhsEvals(void *arkode_mem,long *fe_evals,long *fi_evals)

{
  undefined8 in_RDX;
  int partition_index;
  void *in_RSI;
  int retval;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  partition_index = (int)((ulong)in_RDX >> 0x20);
  local_4 = ARKodeGetNumRhsEvals(in_RSI,partition_index,(long *)(ulong)in_stack_ffffffffffffffd8);
  if ((local_4 == 0) &&
     (local_4 = ARKodeGetNumRhsEvals
                          (in_RSI,partition_index,(long *)(ulong)in_stack_ffffffffffffffd8),
     local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepGetNumRhsEvals(void* arkode_mem, long int* fe_evals, long int* fi_evals)
{
  int retval = ARK_SUCCESS;

  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, fe_evals);
  if (retval != ARK_SUCCESS) { return retval; }

  retval = ARKodeGetNumRhsEvals(arkode_mem, 1, fi_evals);
  if (retval != ARK_SUCCESS) { return retval; }

  return ARK_SUCCESS;
}